

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

void __thiscall ipx::Iterate::Postprocess(Iterate *this)

{
  StateDetail SVar1;
  Model *pMVar2;
  double *pdVar3;
  double *pdVar4;
  Vector *pVVar5;
  double *pdVar6;
  uint uVar7;
  ulong uVar8;
  Int j;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  pMVar2 = this->model_;
  uVar7 = pMVar2->num_cols_ + pMVar2->num_rows_;
  uVar9 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    if ((this->variable_state_).
        super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar9] == FIXED) {
      pdVar3 = (this->x_)._M_data;
      pdVar4 = (pMVar2->lb_)._M_data;
      (this->xl_)._M_data[uVar9] = pdVar3[uVar9] - pdVar4[uVar9];
      pdVar6 = (pMVar2->ub_)._M_data;
      (this->xu_)._M_data[uVar9] = pdVar6[uVar9] - pdVar3[uVar9];
      dVar11 = pdVar4[uVar9];
      pdVar6 = pdVar6 + uVar9;
      if ((dVar11 == *pdVar6) && (!NAN(dVar11) && !NAN(*pdVar6))) {
        dVar11 = (pMVar2->c_)._M_data[uVar9];
        dVar10 = DotColumn(&pMVar2->AI_,(Int)uVar9,&this->y_);
        dVar11 = dVar11 - dVar10;
        dVar10 = -dVar11;
        pVVar5 = &this->zl_;
        if (dVar11 < dVar10) {
          pVVar5 = &this->zu_;
        }
        pVVar5->_M_data[uVar9] =
             (double)(~-(ulong)(dVar11 < dVar10) & (ulong)dVar11 |
                     (ulong)dVar10 & -(ulong)(dVar11 < dVar10));
      }
    }
  }
  uVar9 = 0;
  do {
    if (uVar8 == uVar9) {
      this->evaluated_ = false;
      this->postprocessed_ = true;
      return;
    }
    if ((this->variable_state_).
        super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar9] - IMPLIED_LB < 3) {
      dVar11 = (pMVar2->c_)._M_data[uVar9];
      dVar10 = DotColumn(&pMVar2->AI_,(Int)uVar9,&this->y_);
      dVar11 = dVar11 - dVar10;
      SVar1 = (this->variable_state_).
              super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9];
      if (SVar1 == IMPLIED_LB) {
        (this->zl_)._M_data[uVar9] = dVar11;
        (this->zu_)._M_data[uVar9] = 0.0;
LAB_0037f5ac:
        pdVar6 = (pMVar2->lb_)._M_data;
LAB_0037f5b3:
        dVar11 = pdVar6[uVar9];
        pdVar6 = (this->x_)._M_data;
        pdVar6[uVar9] = dVar11;
      }
      else {
        if (SVar1 == IMPLIED_UB) {
          (this->zl_)._M_data[uVar9] = 0.0;
          (this->zu_)._M_data[uVar9] = -dVar11;
          pdVar6 = (pMVar2->ub_)._M_data;
          goto LAB_0037f5b3;
        }
        if (SVar1 == IMPLIED_EQ) {
          pdVar6 = (this->zl_)._M_data;
          if (0.0 <= dVar11) {
            pdVar6[uVar9] = dVar11;
            dVar11 = 0.0;
          }
          else {
            pdVar6[uVar9] = 0.0;
            dVar11 = -dVar11;
          }
          (this->zu_)._M_data[uVar9] = dVar11;
          goto LAB_0037f5ac;
        }
        pdVar6 = (this->x_)._M_data;
        dVar11 = pdVar6[uVar9];
      }
      (this->xl_)._M_data[uVar9] = dVar11 - (pMVar2->lb_)._M_data[uVar9];
      (this->xu_)._M_data[uVar9] = (pMVar2->ub_)._M_data[uVar9] - pdVar6[uVar9];
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void Iterate::Postprocess() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& c = model_.c();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    // For fixed variables compute xl[j] and xu[j] from x[j]. If the lower and
    // upper bound are equal, set zl[j] or zu[j] such that the variable is dual
    // feasible. Otherwise leave them zero.
    for (Int j = 0; j < n+m; j++) {
        if (StateOf(j) == State::fixed) {
            xl_[j] = x_[j] - lb[j];
            xu_[j] = ub[j] - x_[j];
            assert(zl_[j] == 0.0);
            assert(zu_[j] == 0.0);
            if (lb[j] == ub[j]) {
                double z = c[j] - DotColumn(AI, j, y_);
                if (z >= 0.0)
                    zl_[j] = z;
                else
                    zu_[j] = -z;
            }
        }
    }
    // For implied variables set x[j] to the bound at which it was implied and
    // compute zl[j] or zu[j]. If the variable was implied at both bounds,
    // choose between zl and zu depending on sign.
    for (Int j = 0; j < n+m; j++) {
        if (is_implied(j)) {
            double z = c[j] - DotColumn(AI, j, y_);
            switch (variable_state_[j]) {
            case StateDetail::IMPLIED_EQ:
                assert(lb[j] == ub[j]);
                if (z >= 0.0) {
                    zl_[j] = z;
                    zu_[j] = 0.0;
                } else {
                    zl_[j] = 0.0;
                    zu_[j] = -z;
                }
                x_[j] = lb[j];
                break;
            case StateDetail::IMPLIED_LB:
                zl_[j] = z;
                zu_[j] = 0.0;
                x_[j] = lb[j];
                break;
            case StateDetail::IMPLIED_UB:
                zl_[j] = 0.0;
                zu_[j] = -z;
                x_[j] = ub[j];
                break;
            default:
                assert(0);
            }
            xl_[j] = x_[j] - lb[j];
            xu_[j] = ub[j] - x_[j];
        }
    }
    postprocessed_ = true;
    evaluated_ = false;
}